

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void __thiscall sf::priv::RenderTextureImplFBO::~RenderTextureImplFBO(RenderTextureImplFBO *this)

{
  Context *this_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>,_bool> pVar4;
  pair<unsigned_long_long,_unsigned_int> pVar5;
  value_type local_98;
  _Self local_88;
  _Self local_80;
  iterator iter_1;
  value_type local_58;
  _Self local_48;
  _Self local_40;
  iterator iter;
  GLuint depthStencilBuffer;
  GLuint colorBuffer;
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *local_28;
  Lock local_20;
  Lock lock;
  TransientContextLock contextLock;
  RenderTextureImplFBO *this_local;
  
  (this->super_RenderTextureImpl)._vptr_RenderTextureImpl =
       (_func_int **)&PTR__RenderTextureImplFBO_003332d8;
  GlResource::TransientContextLock::TransientContextLock
            ((TransientContextLock *)((long)&lock.m_mutex + 7));
  Lock::Lock(&local_20,(Mutex *)&(anonymous_namespace)::mutex);
  local_28 = &this->m_frameBuffers;
  std::
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::erase((set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
           *)(anonymous_namespace)::frameBuffers,&local_28);
  _depthStencilBuffer = &this->m_multisampleFrameBuffers;
  std::
  set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::erase((set<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
           *)(anonymous_namespace)::frameBuffers,(key_type *)&depthStencilBuffer);
  if (this->m_colorBuffer != 0) {
    iter._M_node._4_4_ = this->m_colorBuffer;
    (*sf_ptrc_glDeleteRenderbuffersEXT)(1,(GLuint *)((long)&iter._M_node + 4));
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x97,"GLEXT_glDeleteRenderbuffers(1, &colorBuffer)");
  }
  if (this->m_depthStencilBuffer != 0) {
    iter._M_node._0_4_ = this->m_depthStencilBuffer;
    (*sf_ptrc_glDeleteRenderbuffersEXT)(1,(GLuint *)&iter);
    glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                 ,0x9e,"GLEXT_glDeleteRenderbuffers(1, &depthStencilBuffer)");
  }
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
       ::begin(&this->m_frameBuffers);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(&this->m_frameBuffers);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_40);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_40);
    pVar5 = std::make_pair<unsigned_long_long_const&,unsigned_int&>(&ppVar2->first,&ppVar3->second);
    local_58.first = pVar5.first;
    local_58.second = pVar5.second;
    pVar4 = std::
            set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
            ::insert((set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
                      *)(anonymous_namespace)::staleFrameBuffers,&local_58);
    iter_1._M_node = (_Base_ptr)pVar4.first._M_node;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator++
              (&local_40);
  }
  local_80._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
       ::begin(&this->m_multisampleFrameBuffers);
  while( true ) {
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end(&this->m_multisampleFrameBuffers);
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_80);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator->
                       (&local_80);
    pVar5 = std::make_pair<unsigned_long_long_const&,unsigned_int&>(&ppVar2->first,&ppVar3->second);
    local_98.first = pVar5.first;
    local_98.second = pVar5.second;
    std::
    set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
    ::insert((set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
              *)(anonymous_namespace)::staleFrameBuffers,&local_98);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::operator++
              (&local_80);
  }
  anon_unknown.dwarf_e6ba5::destroyStaleFBOs();
  this_00 = this->m_context;
  if (this_00 != (Context *)0x0) {
    Context::~Context(this_00);
    operator_delete(this_00,8);
  }
  Lock::~Lock(&local_20);
  GlResource::TransientContextLock::~TransientContextLock
            ((TransientContextLock *)((long)&lock.m_mutex + 7));
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~map(&this->m_multisampleFrameBuffers);
  std::
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~map(&this->m_frameBuffers);
  GlResource::~GlResource((GlResource *)this);
  RenderTextureImpl::~RenderTextureImpl(&this->super_RenderTextureImpl);
  return;
}

Assistant:

RenderTextureImplFBO::~RenderTextureImplFBO()
{
    TransientContextLock contextLock;

    Lock lock(mutex);

    // Remove the frame buffer mapping from the set of all active mappings
    frameBuffers.erase(&m_frameBuffers);
    frameBuffers.erase(&m_multisampleFrameBuffers);

    // Destroy the color buffer
    if (m_colorBuffer)
    {
        GLuint colorBuffer = static_cast<GLuint>(m_colorBuffer);
        glCheck(GLEXT_glDeleteRenderbuffers(1, &colorBuffer));
    }

    // Destroy the depth/stencil buffer
    if (m_depthStencilBuffer)
    {
        GLuint depthStencilBuffer = static_cast<GLuint>(m_depthStencilBuffer);
        glCheck(GLEXT_glDeleteRenderbuffers(1, &depthStencilBuffer));
    }

    // Move all frame buffer objects to stale set
    for (std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.begin(); iter != m_frameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    for (std::map<Uint64, unsigned int>::iterator iter = m_multisampleFrameBuffers.begin(); iter != m_multisampleFrameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    // Clean up FBOs
    destroyStaleFBOs();

    // Delete the backup context if we had to create one
    delete m_context;
}